

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall format::mtx_arith_error::~mtx_arith_error(mtx_arith_error *this)

{
  ~mtx_arith_error(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

mtx_arith_error
  (
    std::string expected_arith,
    std::string got_arith,
    std::string filename="Unknown",
    std::string msg="Matrix arithmetic mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_arith_ = expected_arith;
   got_arith_ = got_arith;
  }